

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

int __thiscall File::copy(File *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  size_t __count;
  ulong uVar4;
  size_t sVar5;
  int dest;
  off64_t size;
  int fd;
  bool failIfExists_local;
  String *destination_local;
  String *src_local;
  
  pcVar3 = String::operator_cast_to_char_((String *)this);
  uVar1 = ::open(pcVar3,0);
  if (uVar1 == 0xffffffff) {
    src_local._7_1_ = 0;
    uVar4 = (ulong)uVar1;
  }
  else {
    __count = lseek(uVar1,0,2);
    if ((long)__count < 0) {
      src_local._7_1_ = 0;
      uVar4 = __count;
    }
    else {
      uVar4 = lseek(uVar1,0,0);
      if ((long)uVar4 < 0) {
        src_local._7_1_ = 0;
      }
      else {
        pcVar3 = String::operator_cast_to_char_((String *)dst);
        iVar2 = 0x80241;
        if (((ulong)src & 1) != 0) {
          iVar2 = 0x802c1;
        }
        iVar2 = ::open(pcVar3,iVar2,0x1a4);
        if (iVar2 == -1) {
          uVar1 = ::close(uVar1);
          uVar4 = (ulong)uVar1;
          src_local._7_1_ = 0;
        }
        else {
          sVar5 = sendfile(iVar2,uVar1,(off_t *)0x0,__count);
          if (sVar5 == __count) {
            ::close(uVar1);
            uVar1 = ::close(iVar2);
            uVar4 = (ulong)uVar1;
            src_local._7_1_ = 1;
          }
          else {
            ::close(uVar1);
            uVar1 = ::close(iVar2);
            uVar4 = (ulong)uVar1;
            src_local._7_1_ = 0;
          }
        }
      }
    }
  }
  return (int)CONCAT71((int7)(uVar4 >> 8),src_local._7_1_);
}

Assistant:

bool File::copy(const String& src, const String& destination, bool failIfExists)
{
#ifdef _WIN32
  return CopyFile(src, destination, failIfExists) == TRUE;
#else
    int fd = ::open(src, O_RDONLY);
    if(fd == -1)
      return false;
    off64_t size = lseek(fd, 0, SEEK_END);
    if(size < 0)
      return false;
    if(lseek(fd, 0, SEEK_SET) < 0)
      return false;
    int dest = ::open(destination, failIfExists ? (O_CREAT | O_EXCL | O_CLOEXEC | O_TRUNC | O_WRONLY) : (O_CREAT | O_CLOEXEC | O_TRUNC | O_WRONLY), S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH);
    if(dest == -1)
    {
      ::close(fd);
      return false;
    }
    if(sendfile(dest, fd, 0, size) != size)
    {
      ::close(fd);
      ::close(dest);
      return false;
    }
    ::close(fd);
    ::close(dest);
    return true;
#endif
}